

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

ForLoopStatementSyntax * __thiscall
slang::parsing::Parser::parseForLoopStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_01;
  string_view syntaxName;
  Token forKeyword_00;
  Token openParen_00;
  Token semi1_00;
  Token semi2_00;
  Token closeParen_00;
  bool bVar1;
  int iVar2;
  StatementSyntax *pSVar3;
  undefined4 extraout_var;
  ForLoopStatementSyntax *pFVar5;
  EVP_PKEY_CTX *src;
  undefined8 extraout_RDX;
  EVP_PKEY_CTX *src_00;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Token TVar6;
  Token TVar7;
  StatementSyntax *body;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> steps;
  Token closeParen;
  Token semi2;
  ExpressionSyntax *stopExpr;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> initializers;
  Token semi1;
  Token openParen;
  Token forKeyword;
  undefined1 in_stack_00000726;
  undefined1 in_stack_00000727;
  Parser *in_stack_00000728;
  undefined8 in_stack_fffffffffffffbe8;
  size_t __len;
  Token *in_stack_fffffffffffffbf0;
  Parser *this_00;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> *this_01;
  undefined4 uVar8;
  undefined2 in_stack_fffffffffffffbfc;
  TokenKind in_stack_fffffffffffffbfe;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc00;
  ParserBase *in_stack_fffffffffffffc10;
  SyntaxNode *in_stack_fffffffffffffc18;
  Parser *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  Info *in_stack_fffffffffffffc40;
  undefined8 uVar9;
  undefined8 *puVar10;
  undefined6 uVar11;
  TokenKind in_stack_fffffffffffffc7e;
  undefined2 uVar12;
  ParserBase *in_stack_fffffffffffffc80;
  StatementSyntax *stopExpr_00;
  StatementSyntax *pSVar13;
  Info *pIVar14;
  Info *in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  undefined8 uVar15;
  Info *in_stack_fffffffffffffca8;
  Info *in_stack_fffffffffffffcb0;
  Parser *in_stack_fffffffffffffcb8;
  RequireItems in_stack_fffffffffffffd04;
  SyntaxNode *in_stack_fffffffffffffd08;
  TokenKind in_stack_fffffffffffffd14;
  TokenKind in_stack_fffffffffffffd16;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffd18;
  ParserBase *in_stack_fffffffffffffd20;
  DiagCode in_stack_fffffffffffffd30;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffd38;
  AllowEmpty in_stack_fffffffffffffd40;
  Token TVar16;
  undefined1 local_1c0 [16];
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_1b0 [2];
  SyntaxFactory *local_138;
  undefined8 uStack_130;
  Token local_128;
  Token local_118;
  Token local_108;
  Info *local_f8;
  undefined1 local_f0 [24];
  Token local_d8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_c8 [2];
  Token local_40;
  Token local_30;
  Token local_20 [2];
  Info *pIVar4;
  
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  local_20[0]._0_8_ = in_RSI;
  local_30 = ParserBase::consume(in_stack_fffffffffffffc10);
  local_40 = ParserBase::expect(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7e);
  Token::Token(in_stack_fffffffffffffbf0);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8d6da8);
  bVar1 = isVariableDeclaration(in_stack_fffffffffffffcb8);
  if (bVar1) {
    local_d8.kind = IntegerLiteral;
    local_d8._2_1_ = 0x3c;
    local_d8.numFlags.raw = '\0';
    this_00 = (Parser *)(local_f0 + 0x10);
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleForInitializer,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseForLoopStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd16,
               in_stack_fffffffffffffd14,(Token *)in_stack_fffffffffffffd08,
               in_stack_fffffffffffffd04,in_stack_fffffffffffffd30,in_stack_fffffffffffffd38,
               in_stack_fffffffffffffd40);
  }
  else {
    local_f0._12_4_ = 0x3c0005;
    this_00 = (Parser *)local_f0;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseForLoopStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__1>
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd16,
               in_stack_fffffffffffffd14,(Token *)in_stack_fffffffffffffd08,
               in_stack_fffffffffffffd04,in_stack_fffffffffffffd30,in_stack_fffffffffffffd38,
               in_stack_fffffffffffffd40);
  }
  local_f8 = (Info *)0x0;
  Token::Token((Token *)this_00);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffc00._M_extent_value,
                           in_stack_fffffffffffffbfe);
  if (bVar1) {
    TVar6 = ParserBase::consume(in_stack_fffffffffffffc10);
    TVar7.info = in_stack_fffffffffffffc98;
    TVar7.kind = (short)in_stack_fffffffffffffca0;
    TVar7._2_1_ = (char)((ulong)in_stack_fffffffffffffca0 >> 0x10);
    TVar7.numFlags.raw = (char)((ulong)in_stack_fffffffffffffca0 >> 0x18);
    TVar7.rawLen = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
    local_118 = TVar6;
    local_108 = TVar6;
  }
  else {
    in_stack_fffffffffffffca8 = (Info *)parseExpression(this_00);
    local_f8 = in_stack_fffffffffffffca8;
    TVar7 = ParserBase::expect(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7e);
    TVar6.info = in_stack_fffffffffffffcb0;
    TVar6._0_8_ = in_stack_fffffffffffffcb8;
    local_128 = TVar7;
    local_108 = TVar7;
  }
  Token::Token((Token *)this_00);
  pIVar14 = (Info *)(local_1c0 + 0x10);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8d6ffa);
  local_1c0._12_4_ = 0x10001;
  this_01 = (SeparatedSyntaxList<slang::syntax::SyntaxNode> *)local_1c0;
  __len = CONCAT44(uVar8,0x10001);
  uVar8 = 0;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseForLoopStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__2>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd16,
             in_stack_fffffffffffffd14,(Token *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd38,in_stack_fffffffffffffd40);
  pSVar3 = parseStatement(in_stack_00000728,(bool)in_stack_00000727,(bool)in_stack_00000726);
  stopExpr_00 = pSVar3;
  pSVar13 = pSVar3;
  sv((char *)this_01,__len);
  TVar16.info = in_stack_fffffffffffffc40;
  TVar16.kind = (short)in_stack_fffffffffffffc38;
  TVar16._2_1_ = (char)((ulong)in_stack_fffffffffffffc38 >> 0x10);
  TVar16.numFlags.raw = (char)((ulong)in_stack_fffffffffffffc38 >> 0x18);
  TVar16.rawLen = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  syntaxName._M_str = in_stack_fffffffffffffc30;
  syntaxName._M_len = in_stack_fffffffffffffc28;
  checkEmptyBody(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,TVar16,syntaxName);
  puVar10 = in_RDI + 0x1c;
  uVar11 = (undefined6)local_20[0]._0_8_;
  uVar12 = SUB82(local_20[0]._0_8_,6);
  elements._M_ptr._4_2_ = in_stack_fffffffffffffbfc;
  elements._M_ptr._0_4_ = uVar8;
  elements._M_ptr._6_2_ = in_stack_fffffffffffffbfe;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffc00._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_01,elements);
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy(local_c8,(EVP_PKEY_CTX *)*in_RDI,src);
  pIVar4 = (Info *)CONCAT44(extraout_var,iVar2);
  elements_00._M_ptr._4_2_ = in_stack_fffffffffffffbfc;
  elements_00._M_ptr._0_4_ = uVar8;
  elements_00._M_ptr._6_2_ = in_stack_fffffffffffffbfe;
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffc00._M_extent_value;
  uVar9 = extraout_RDX;
  slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::SeparatedSyntaxList
            (this_01,elements_00);
  TVar16 = local_108;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)(local_1c0 + 0x10),
             (EVP_PKEY_CTX *)*in_RDI,src_00);
  elements_01._M_ptr._4_2_ = in_stack_fffffffffffffbfc;
  elements_01._M_ptr._0_4_ = uVar8;
  elements_01._M_ptr._6_2_ = in_stack_fffffffffffffbfe;
  elements_01._M_extent._M_extent_value = in_stack_fffffffffffffc00._M_extent_value;
  slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)this_01,elements_01);
  uVar15 = TVar7._0_8_;
  forKeyword_00.info = (Info *)pSVar3;
  forKeyword_00.kind = (undefined2)uStack_130;
  forKeyword_00._2_1_ = uStack_130._2_1_;
  forKeyword_00.numFlags.raw = uStack_130._3_1_;
  forKeyword_00.rawLen = uStack_130._4_4_;
  openParen_00.info = pIVar4;
  openParen_00.kind = (short)uVar9;
  openParen_00._2_1_ = (char)((ulong)uVar9 >> 0x10);
  openParen_00.numFlags.raw = (char)((ulong)uVar9 >> 0x18);
  openParen_00.rawLen = (int)((ulong)uVar9 >> 0x20);
  semi1_00.info._0_6_ = uVar11;
  semi1_00._0_8_ = puVar10;
  semi1_00.info._6_2_ = uVar12;
  semi2_00.info = pIVar14;
  semi2_00._0_8_ = pSVar13;
  closeParen_00.info = in_stack_fffffffffffffca8;
  closeParen_00.kind = (short)uVar15;
  closeParen_00._2_1_ = (char)((ulong)uVar15 >> 0x10);
  closeParen_00.numFlags.raw = (char)((ulong)uVar15 >> 0x18);
  closeParen_00.rawLen = (int)((ulong)uVar15 >> 0x20);
  pFVar5 = slang::syntax::SyntaxFactory::forLoopStatement
                     (local_138,(NamedLabelSyntax *)&stack0xfffffffffffffd00,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar16.info,
                      forKeyword_00,openParen_00,TVar16._0_8_,semi1_00,
                      (ExpressionSyntax *)stopExpr_00,semi2_00,
                      (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)TVar7.info,
                      closeParen_00,(StatementSyntax *)TVar6.info);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8d730c);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8d7319);
  return pFVar5;
}

Assistant:

ForLoopStatementSyntax& Parser::parseForLoopStatement(NamedLabelSyntax* label,
                                                      AttrList attributes) {
    auto forKeyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);

    Token semi1;
    SmallVector<TokenOrSyntax, 4> initializers;

    if (isVariableDeclaration()) {
        parseList<isPossibleForInitializer, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] { return &parseForInitializer(); });
    }
    else {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] {
                auto& expr = parseExpression();
                if (expr.kind != SyntaxKind::AssignmentExpression &&
                    (expr.kind != SyntaxKind::IdentifierName ||
                     !expr.getFirstToken().isMissing())) {
                    // Initializer expressions must be variable assignments.
                    addDiag(diag::InvalidForInitializer, expr.sourceRange());
                }
                return &expr;
            });
    }

    ExpressionSyntax* stopExpr = nullptr;
    Token semi2;
    if (peek(TokenKind::Semicolon)) {
        semi2 = consume();
    }
    else {
        stopExpr = &parseExpression();
        semi2 = expect(TokenKind::Semicolon);
    }

    Token closeParen;
    SmallVector<TokenOrSyntax, 4> steps;
    parseList<isPossibleExpressionOrComma, isEndOfParenList>(
        steps, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedExpression, [this] { return &parseExpression(); });

    auto& body = parseStatement();

    checkEmptyBody(body, closeParen, "for loop"sv);

    return factory.forLoopStatement(label, attributes, forKeyword, openParen,
                                    initializers.copy(alloc), semi1, stopExpr, semi2,
                                    steps.copy(alloc), closeParen, body);
}